

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O2

void __thiscall addrman_tests::addrman_new_multiplicity::test_method(addrman_new_multiplicity *this)

{
  long lVar1;
  CService ipIn;
  __single_object _Var2;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  int *piVar5;
  AddressPosition *pAVar6;
  int iVar7;
  long lVar8;
  long in_FS_OFFSET;
  initializer_list<CAddress> __l;
  const_string file;
  const_string file_00;
  initializer_list<CAddress> __l_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  undefined8 in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  uint local_1dc;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  AddressPosition addr_pos;
  uint local_15c;
  __single_object addrman;
  _Storage<AddressPosition,_true> local_150;
  undefined1 *local_140 [5];
  string local_118;
  string local_f8;
  CNetAddr source;
  AddressPosition addr_pos_multi;
  CService local_98;
  CAddress addr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  addr.super_CService.super_CNetAddr.m_addr._union._0_4_ =
       GetCheckRatio(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)&addrman,(bool *)&EMPTY_NETGROUPMAN,(int *)&DETERMINISTIC);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150._M_value,"253.3.3.3",(allocator<char> *)&addr_pos_multi);
  ResolveService(&local_98,(string *)&local_150._M_value,0x208d);
  ipIn.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffffdc0;
  ipIn.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)in_stack_fffffffffffffdb8;
  ipIn.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffffdc8;
  ipIn.super_CNetAddr.m_net = (int)in_stack_fffffffffffffdd0;
  ipIn.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
  ipIn._32_8_ = in_stack_fffffffffffffdd8;
  CAddress::CAddress(&addr,ipIn,(ServiceFlags)&local_98);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_98);
  std::__cxx11::string::~string((string *)&local_150._M_value);
  tVar3 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  addr.nTime.__d.__r = (duration)(duration)tVar3;
  for (iVar7 = 1; iVar7 != 0x14; iVar7 = iVar7 + 1) {
    addr_pos._0_4_ = iVar7;
    util::ToString<unsigned_int>(&local_f8,(uint *)&addr_pos);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&source,
                   &local_f8,".");
    local_15c = 0;
    util::ToString<unsigned_int>(&local_118,&local_15c);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_150._M_value,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&source,
                   &local_118);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &addr_pos_multi,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_150._M_value,".1.1");
    std::__cxx11::string::~string((string *)&local_150._M_value);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&source);
    std::__cxx11::string::~string((string *)&local_f8);
    ResolveIP(&source,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &addr_pos_multi);
    _Var2 = addrman;
    CAddress::CAddress((CAddress *)&local_150._M_value,&addr);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_150;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)&local_f8,__l,
               (allocator_type *)&local_118);
    AddrMan::Add((AddrMan *)
                 _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                 super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                 super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                 (vector<CAddress,_std::allocator<CAddress>_> *)&local_f8,&source,(seconds)0x0);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)&local_f8);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_150._M_value);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&source);
    std::__cxx11::string::~string((string *)&addr_pos_multi);
  }
  AddrMan::FindAddressEntry
            ((optional<AddressPosition> *)&local_150._M_value,
             (AddrMan *)
             addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr);
  if ((char)local_140[0] == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    addr_pos.tried = local_150._M_value.tried;
    addr_pos._1_3_ = local_150._1_3_;
    addr_pos.multiplicity = local_150._M_value.multiplicity;
    local_188 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_180 = "";
    local_198 = &boost::unit_test::basic_cstring<char_const>::null;
    local_190 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x146;
    file.m_begin = (iterator)&local_188;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_198,msg);
    local_150.field2[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_011480b0;
    local_140[0] = boost::unit_test::lazy_ostream::inst;
    local_140[1] = "";
    local_1a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_1a0 = "";
    piVar5 = &addr_pos.multiplicity;
    addr_pos_multi._0_4_ = 1;
    pvVar4 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_int>
              (&local_150,&local_1a8,0x146,1,2,piVar5,"addr_pos.multiplicity",&addr_pos_multi,"1U");
    local_1b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_1b0 = "";
    local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x147;
    file_00.m_begin = (iterator)&local_1b8;
    msg_00.m_end = (iterator)piVar5;
    msg_00.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1c8,
               msg_00);
    local_150.field2[8] = 0;
    local_150._0_8_ = &PTR__lazy_ostream_011480b0;
    local_140[0] = boost::unit_test::lazy_ostream::inst;
    local_140[1] = "";
    local_1d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_1d0 = "";
    addr_pos_multi._0_8_ =
         AddrMan::Size((AddrMan *)
                       addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                       _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(optional<Network>)0x0,
                       (optional<bool>)0x0);
    pAVar6 = &addr_pos_multi;
    source.m_addr._union._0_4_ = 1;
    pvVar4 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&local_150,&local_1d8,0x147,1,2,pAVar6,"addrman->Size()",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&source,"1U");
    for (lVar8 = 1; lVar8 != 400; lVar8 = lVar8 + 1) {
      local_15c = (uint)lVar8 & 0xff;
      util::ToString<unsigned_int>(&local_f8,&local_15c);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&source,
                     &local_f8,".");
      local_1dc = (uint)((ulong)lVar8 >> 8) & 0xffffff;
      util::ToString<unsigned_int>(&local_118,&local_1dc);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_150._M_value,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&source,
                     &local_118);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &addr_pos_multi,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_150._M_value,".1.1");
      std::__cxx11::string::~string((string *)&local_150._M_value);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&source);
      std::__cxx11::string::~string((string *)&local_f8);
      ResolveIP(&source,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &addr_pos_multi);
      _Var2 = addrman;
      addr.nTime.__d.__r = (duration)((long)tVar3.__d.__r + lVar8);
      CAddress::CAddress((CAddress *)&local_150._M_value,&addr);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_150;
      std::vector<CAddress,_std::allocator<CAddress>_>::vector
                ((vector<CAddress,_std::allocator<CAddress>_> *)&local_f8,__l_00,
                 (allocator_type *)&local_118);
      AddrMan::Add((AddrMan *)
                   _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                   super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                   super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                   (vector<CAddress,_std::allocator<CAddress>_> *)&local_f8,&source,(seconds)0x0);
      std::vector<CAddress,_std::allocator<CAddress>_>::~vector
                ((vector<CAddress,_std::allocator<CAddress>_> *)&local_f8);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_150._M_value);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&source);
      std::__cxx11::string::~string((string *)&addr_pos_multi);
    }
    AddrMan::FindAddressEntry
              ((optional<AddressPosition> *)&local_150._M_value,
               (AddrMan *)
               addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
               super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
               super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr);
    if ((char)local_140[0] == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      addr_pos_multi._9_7_ = local_150._9_7_;
      addr_pos_multi.bucket._0_1_ = local_150.field2[8];
      addr_pos_multi.tried = local_150._M_value.tried;
      addr_pos_multi._1_3_ = local_150._1_3_;
      addr_pos_multi.multiplicity = local_150._M_value.multiplicity;
      local_1f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_1e8 = "";
      local_200 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x153;
      file_01.m_begin = (iterator)&local_1f0;
      msg_01.m_end = &pAVar6->tried;
      msg_01.m_begin = pvVar4;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_200,
                 msg_01);
      local_150.field2[8] = 0;
      local_150._0_8_ = &PTR__lazy_ostream_011480b0;
      local_140[0] = boost::unit_test::lazy_ostream::inst;
      local_140[1] = "";
      local_210 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_208 = "";
      piVar5 = &addr_pos_multi.multiplicity;
      source.m_addr._union._0_4_ = 8;
      pvVar4 = (iterator)0x2;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_int>
                (&local_150,&local_210,0x153,1,2,piVar5,"addr_pos_multi.multiplicity",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&source,"8U");
      local_220 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_218 = "";
      file_02.m_end = (iterator)0x155;
      file_02.m_begin = (iterator)&local_220;
      msg_02.m_end = (iterator)piVar5;
      msg_02.m_begin = pvVar4;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
                 (size_t)&stack0xfffffffffffffdd0,msg_02);
      local_150.field2[8] = 0;
      local_150._0_8_ = &PTR__lazy_ostream_011480b0;
      local_140[0] = boost::unit_test::lazy_ostream::inst;
      local_140[1] = "";
      source.m_addr._union.indirect_contents.indirect =
           (char *)AddrMan::Size((AddrMan *)
                                 addrman._M_t.
                                 super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                                 super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                                 super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                                 (optional<Network>)0x0,(optional<bool>)0x0);
      local_f8._M_dataplus._M_p._0_4_ = 1;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (&local_150,&stack0xfffffffffffffdc0,0x155,1,2,&source,"addrman->Size()",&local_f8,
                 "1U");
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
      std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_new_multiplicity)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    CAddress addr{CAddress(ResolveService("253.3.3.3", 8333), NODE_NONE)};
    const auto start_time{Now<NodeSeconds>()};
    addr.nTime = start_time;

    // test that multiplicity stays at 1 if nTime doesn't increase
    for (unsigned int i = 1; i < 20; ++i) {
        std::string addr_ip{ToString(i % 256) + "." + ToString(i >> 8 % 256) + ".1.1"};
        CNetAddr source{ResolveIP(addr_ip)};
        addrman->Add({addr}, source);
    }
    AddressPosition addr_pos = addrman->FindAddressEntry(addr).value();
    BOOST_CHECK_EQUAL(addr_pos.multiplicity, 1U);
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);

    // if nTime increases, an addr can occur in up to 8 buckets
    // The acceptance probability decreases exponentially with existing multiplicity -
    // choose number of iterations such that it gets to 8 with deterministic addrman.
    for (unsigned int i = 1; i < 400; ++i) {
        std::string addr_ip{ToString(i % 256) + "." + ToString(i >> 8 % 256) + ".1.1"};
        CNetAddr source{ResolveIP(addr_ip)};
        addr.nTime = start_time + std::chrono::seconds{i};
        addrman->Add({addr}, source);
    }
    AddressPosition addr_pos_multi = addrman->FindAddressEntry(addr).value();
    BOOST_CHECK_EQUAL(addr_pos_multi.multiplicity, 8U);
    // multiplicity doesn't affect size
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);
}